

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenePreprocessor.cpp
# Opt level: O3

void __thiscall Assimp::ScenePreprocessor::ProcessMesh(ScenePreprocessor *this,aiMesh *mesh)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint i_1;
  Logger *this_00;
  ulong uVar5;
  aiVector3D *paVar6;
  ulong uVar7;
  float *pfVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint i;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar17;
  int iVar18;
  undefined1 auVar16 [16];
  undefined1 auVar19 [16];
  float fVar20;
  int iVar22;
  float fVar23;
  undefined1 auVar21 [16];
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar15 [16];
  
  lVar13 = 0;
  auVar26 = _DAT_006dcf30;
  auVar27 = _DAT_006dcf40;
  auVar28 = _DAT_006da020;
  do {
    paVar6 = mesh->mTextureCoords[lVar13];
    uVar10 = 0;
    if (paVar6 == (aiVector3D *)0x0) {
LAB_00394ddb:
      mesh->mNumUVComponents[lVar13] = uVar10;
    }
    else {
      uVar10 = mesh->mNumUVComponents[lVar13];
      if (uVar10 == 0) {
        mesh->mNumUVComponents[lVar13] = 2;
        paVar6 = mesh->mTextureCoords[lVar13];
        uVar7 = (ulong)mesh->mNumVertices;
LAB_00394dfc:
        if ((int)uVar7 != 0) {
          uVar7 = uVar7 * 0xc - 0xc;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = uVar7;
          uVar14 = SUB164(auVar21 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
          uVar17 = (undefined4)(uVar7 / 0x180000000);
          auVar15._0_8_ = CONCAT44(uVar17,uVar14);
          auVar15._8_4_ = uVar14;
          auVar15._12_4_ = uVar17;
          auVar16._0_8_ = auVar15._0_8_ >> 3;
          auVar16._8_8_ = auVar15._8_8_ >> 3;
          pfVar8 = &paVar6[3].z;
          auVar16 = auVar16 ^ auVar28;
          uVar5 = 0;
          do {
            auVar19._8_4_ = (int)uVar5;
            auVar19._0_8_ = uVar5;
            auVar19._12_4_ = (int)(uVar5 >> 0x20);
            auVar21 = (auVar19 | auVar27) ^ auVar28;
            iVar18 = auVar16._4_4_;
            if ((bool)(~(iVar18 < auVar21._4_4_ ||
                        auVar16._0_4_ < auVar21._0_4_ && auVar21._4_4_ == iVar18) & 1)) {
              pfVar8[-9] = 0.0;
            }
            if (auVar21._12_4_ <= auVar16._12_4_ &&
                (auVar21._8_4_ <= auVar16._8_4_ || auVar21._12_4_ != auVar16._12_4_)) {
              pfVar8[-6] = 0.0;
            }
            auVar21 = (auVar19 | auVar26) ^ auVar28;
            iVar22 = auVar21._4_4_;
            if (iVar22 <= iVar18 && (iVar22 != iVar18 || auVar21._0_4_ <= auVar16._0_4_)) {
              pfVar8[-3] = 0.0;
              *pfVar8 = 0.0;
            }
            uVar5 = uVar5 + 4;
            pfVar8 = pfVar8 + 0xc;
          } while ((uVar7 / 0xc + 4 & 0xfffffffffffffffc) != uVar5);
        }
      }
      else {
        uVar11 = mesh->mNumVertices;
        uVar7 = (ulong)uVar11;
        if (uVar10 == 1) {
          if (uVar11 != 0) {
            lVar9 = 0;
            do {
              *(undefined8 *)((long)&paVar6->y + lVar9) = 0;
              lVar9 = lVar9 + 0xc;
            } while (uVar7 * 0xc != lVar9);
          }
        }
        else {
          if (uVar10 == 2) goto LAB_00394dfc;
          if (uVar10 == 3) {
            if (uVar11 != 0) {
              lVar9 = 0;
              do {
                fVar1 = *(float *)((long)&paVar6->z + lVar9);
                if ((fVar1 != 0.0) || (NAN(fVar1))) goto LAB_00394f1e;
                lVar9 = lVar9 + 0xc;
              } while (uVar7 * 0xc != lVar9);
            }
            this_00 = DefaultLogger::get();
            Logger::warn(this_00,
                         "ScenePreprocessor: UVs are declared to be 3D but they\'re obviously not. Reverting to 2D."
                        );
            uVar10 = 2;
            auVar26 = _DAT_006dcf30;
            auVar27 = _DAT_006dcf40;
            auVar28 = _DAT_006da020;
            goto LAB_00394ddb;
          }
        }
      }
    }
LAB_00394f1e:
    lVar13 = lVar13 + 1;
    if (lVar13 == 8) {
      if ((mesh->mPrimitiveTypes == 0) && ((ulong)mesh->mNumFaces != 0)) {
        lVar13 = 0;
        uVar10 = 0;
        do {
          uVar12 = *(int *)((long)&mesh->mFaces->mNumIndices + lVar13) - 1;
          uVar11 = 8;
          if (uVar12 < 3) {
            uVar11 = *(uint *)(&DAT_006ff99c + (ulong)uVar12 * 4);
          }
          uVar10 = uVar10 | uVar11;
          mesh->mPrimitiveTypes = uVar10;
          lVar13 = lVar13 + 0x10;
        } while ((ulong)mesh->mNumFaces << 4 != lVar13);
      }
      if (((mesh->mTangents != (aiVector3D *)0x0) && (mesh->mNormals != (aiVector3D *)0x0)) &&
         (mesh->mBitangents == (aiVector3D *)0x0)) {
        uVar10 = mesh->mNumVertices;
        uVar7 = (ulong)uVar10 * 0xc;
        paVar6 = (aiVector3D *)operator_new__(uVar7);
        if ((ulong)uVar10 == 0) {
          mesh->mBitangents = paVar6;
        }
        else {
          lVar13 = 0;
          memset(paVar6,0,((uVar7 - 0xc) / 0xc) * 0xc + 0xc);
          mesh->mBitangents = paVar6;
          uVar7 = 0;
          do {
            fVar1 = *(float *)((long)&mesh->mTangents->x + lVar13);
            fVar2 = *(float *)((long)&mesh->mNormals->x + lVar13);
            uVar3 = *(undefined8 *)((long)&mesh->mNormals->y + lVar13);
            uVar4 = *(undefined8 *)((long)&mesh->mTangents->y + lVar13);
            fVar20 = (float)uVar3;
            fVar23 = (float)((ulong)uVar3 >> 0x20);
            fVar24 = (float)uVar4;
            fVar25 = (float)((ulong)uVar4 >> 0x20);
            paVar6 = mesh->mBitangents;
            *(ulong *)((long)&paVar6->x + lVar13) =
                 CONCAT44(fVar1 * fVar23 - fVar2 * fVar25,fVar25 * fVar20 - fVar23 * fVar24);
            *(float *)((long)&paVar6->z + lVar13) = fVar2 * fVar24 - fVar1 * fVar20;
            uVar7 = uVar7 + 1;
            lVar13 = lVar13 + 0xc;
          } while (uVar7 < mesh->mNumVertices);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void ScenePreprocessor::ProcessMesh (aiMesh* mesh)
{
    // If aiMesh::mNumUVComponents is *not* set assign the default value of 2
    for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i)   {
        if (!mesh->mTextureCoords[i]) {
            mesh->mNumUVComponents[i] = 0;
        } else {
            if (!mesh->mNumUVComponents[i])
                mesh->mNumUVComponents[i] = 2;

            aiVector3D* p = mesh->mTextureCoords[i], *end = p+mesh->mNumVertices;

            // Ensure unused components are zeroed. This will make 1D texture channels work
            // as if they were 2D channels .. just in case an application doesn't handle
            // this case
            if (2 == mesh->mNumUVComponents[i]) {
                for (; p != end; ++p)
                    p->z = 0.f;
            }
            else if (1 == mesh->mNumUVComponents[i]) {
                for (; p != end; ++p)
                    p->z = p->y = 0.f;
            }
            else if (3 == mesh->mNumUVComponents[i]) {
                // Really 3D coordinates? Check whether the third coordinate is != 0 for at least one element
                for (; p != end; ++p) {
                    if (p->z != 0)
                        break;
                }
                if (p == end) {
                    ASSIMP_LOG_WARN("ScenePreprocessor: UVs are declared to be 3D but they're obviously not. Reverting to 2D.");
                    mesh->mNumUVComponents[i] = 2;
                }
            }
        }
    }

    // If the information which primitive types are there in the
    // mesh is currently not available, compute it.
    if (!mesh->mPrimitiveTypes) {
        for (unsigned int a = 0; a < mesh->mNumFaces; ++a)  {
            aiFace& face = mesh->mFaces[a];
            switch (face.mNumIndices)
            {
            case 3u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                break;

            case 2u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                break;

            case 1u:
                mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                break;

            default:
                mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                break;
            }
        }
    }

    // If tangents and normals are given but no bitangents compute them
    if (mesh->mTangents && mesh->mNormals && !mesh->mBitangents)    {

        mesh->mBitangents = new aiVector3D[mesh->mNumVertices];
        for (unsigned int i = 0; i < mesh->mNumVertices;++i)    {
            mesh->mBitangents[i] = mesh->mNormals[i] ^ mesh->mTangents[i];
        }
    }
}